

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButton::mouseMoveEvent(QAbstractButton *this,QMouseEvent *e)

{
  byte bVar1;
  long lVar2;
  QAbstractButtonPrivate *this_00;
  QMouseEvent QVar3;
  char cVar4;
  undefined4 in_ECX;
  undefined4 uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)e[0x44] & 1) == 0) ||
     (this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8,
     (this_00->field_0x28c & 0x40) == 0)) {
LAB_003c58cd:
    QVar3 = (QMouseEvent)0x0;
  }
  else {
    auVar9 = QEventPoint::position();
    auVar8._0_8_ = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar9._8_8_;
    auVar8._8_8_ = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar9._0_8_;
    auVar8 = minpd(_DAT_0066f5d0,auVar8);
    auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
    auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
    uVar5 = movmskpd(in_ECX,auVar9);
    cVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
    bVar1 = this_00->field_0x28c;
    uVar5 = CONCAT31((int3)((uint)uVar5 >> 8),bVar1);
    if (((bVar1 & 0x10) == 0) != (bool)cVar4) {
      auVar8 = QEventPoint::position();
      auVar6._0_8_ = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar8._8_8_;
      auVar6._8_8_ = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar8._0_8_;
      auVar8 = minpd(_DAT_0066f5d0,auVar6);
      auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
      auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
      movmskpd(uVar5,auVar7);
      cVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar4 != '\0') goto LAB_003c58d2;
      goto LAB_003c58cd;
    }
    setDown(this,(bVar1 & 0x10) == 0);
    QWidget::repaint(&this->super_QWidget);
    if ((this_00->field_0x28c & 0x10) == 0) {
      QAbstractButtonPrivate::emitReleased(this_00);
    }
    else {
      QAbstractButtonPrivate::emitPressed(this_00);
    }
    QVar3 = (QMouseEvent)0x1;
  }
  e[0xc] = QVar3;
LAB_003c58d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);
    if (!(e->buttons() & Qt::LeftButton) || !d->pressed) {
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint()) != d->down) {
        setDown(!d->down);
        repaint();
        if (d->down)
            d->emitPressed();
        else
            d->emitReleased();
        e->accept();
    } else if (!hitButton(e->position().toPoint())) {
        e->ignore();
    }
}